

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorDynSize.cpp
# Opt level: O2

void __thiscall
iDynTree::VectorDynSize::changeCapacityAndCopyData(VectorDynSize *this,size_t _newCapacity)

{
  double *__src;
  double *__dest;
  
  if (_newCapacity == 0) {
    if (this->m_data != (double *)0x0) {
      operator_delete__(this->m_data);
    }
    this->m_data = (double *)0x0;
    this->m_size = 0;
    this->m_capacity = 0;
  }
  else {
    __dest = (double *)operator_new__(-(ulong)(_newCapacity >> 0x3d != 0) | _newCapacity * 8);
    __src = this->m_data;
    if (__src != (double *)0x0) {
      if (this->m_size <= _newCapacity) {
        memcpy(__dest,__src,this->m_size << 3);
      }
      operator_delete__(__src);
    }
    this->m_capacity = _newCapacity;
    this->m_data = __dest;
  }
  return;
}

Assistant:

void VectorDynSize::changeCapacityAndCopyData(const std::size_t _newCapacity)
{
    //Corner case: zero capacity
    if (_newCapacity == 0) {
        delete [] this->m_data;
        m_data = 0;
        this->m_size = 0;
        this->m_capacity = 0;
        return;
    }

    double *localBuf = new double[_newCapacity];

    if (this->m_data && this->m_size <= _newCapacity) {
        memcpy(localBuf, this->m_data, this->m_size * sizeof(double));
    }
    if (this->m_data) {
        delete [] this->m_data;
        this->m_data = 0;
    }

    this->m_capacity = _newCapacity;
    this->m_data = localBuf;
}